

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcSurfaceStyleRendering::~IfcSurfaceStyleRendering
          (IfcSurfaceStyleRendering *this,void **vtt)

{
  void **vtt_local;
  IfcSurfaceStyleRendering *this_local;
  
  (this->super_IfcSurfaceStyleShading).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyleShading,_1UL>._vptr_ObjectHelper =
       (_func_int **)*vtt;
  *(void **)((long)&(this->super_IfcSurfaceStyleShading).
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyleShading,_1UL>.
                    _vptr_ObjectHelper +
            (long)(this->super_IfcSurfaceStyleShading).
                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyleShading,_1UL>.
                  _vptr_ObjectHelper[-3]) = vtt[7];
  *(void **)&(this->super_IfcSurfaceStyleShading).
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyleShading,_1UL>.field_0x18 =
       vtt[8];
  std::__cxx11::string::~string((string *)&this->ReflectanceMethod);
  STEP::Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>::~Maybe
            (&this->SpecularHighlight);
  STEP::Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>::~Maybe
            (&this->SpecularColour);
  STEP::Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>::~Maybe
            (&this->ReflectionColour);
  STEP::Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>::~Maybe
            (&this->DiffuseTransmissionColour);
  STEP::Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>::~Maybe
            (&this->TransmissionColour);
  STEP::Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>::~Maybe(&this->DiffuseColour)
  ;
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyleRendering,_8UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyleRendering,_8UL> *)
             &(this->super_IfcSurfaceStyleShading).
              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyleShading,_1UL>.field_0x18,
             vtt + 5);
  IfcSurfaceStyleShading::~IfcSurfaceStyleShading(&this->super_IfcSurfaceStyleShading,vtt + 1);
  return;
}

Assistant:

IfcSurfaceStyleRendering() : Object("IfcSurfaceStyleRendering") {}